

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::CanInlineBuiltInFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,OpCode inlineCallOpCode,
          FunctionJITTimeInfo *inlinerData,BuiltinFunction builtInId,bool isCallApplyTarget)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint uVar4;
  BOOL BVar5;
  uint uVar6;
  uint uVar7;
  BuiltInFlags BVar8;
  JITTimeProfileInfo *this_00;
  char16 *pcVar9;
  JITTimeFunctionBody *pJVar10;
  char16 *pcVar11;
  SymOpnd *pSVar12;
  StackSym *pSVar13;
  char16 *pcVar14;
  undefined4 *puVar15;
  RegOpnd *pRVar16;
  size_t sVar17;
  undefined6 in_register_0000000a;
  char16_t *pcVar18;
  Opnd *pOVar19;
  int iVar20;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  
  iVar20 = (int)CONCAT62(in_register_0000000a,inlineCallOpCode);
  uVar4 = iVar20 - 0x25e;
  if ((uVar4 < 7) && ((0x43U >> (uVar4 & 0x1f) & 1) != 0)) {
    BVar5 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
    if (BVar5 == 0) {
      uVar6 = Func::GetSourceContextId(this->topFunc);
      uVar7 = Func::GetLocalFunctionId(this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
      if (!bVar2) {
        return false;
      }
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar18 = L"INLINING: Skip Inline: SSE4.1 not available\tInlinee: %s (#%d)\tCaller: %s\n";
LAB_005061aa:
      Output::Print(pcVar18,pcVar9,(ulong)builtInId._value,pcVar11);
      goto LAB_005067be;
    }
    bVar2 = Func::HasProfileInfo(callInstr->m_func->topFunc);
    if (bVar2) {
      this_00 = Func::GetReadOnlyProfileInfo(callInstr->m_func->topFunc);
      bVar2 = JITTimeProfileInfo::IsFloorInliningDisabled(this_00);
      if (bVar2) {
        uVar6 = Func::GetSourceContextId(this->topFunc);
        uVar7 = Func::GetLocalFunctionId(this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
        if (!bVar2) {
          return false;
        }
        pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
        pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        pcVar18 = L"INLINING: Skip Inline: Floor Inlining Disabled\tInlinee: %s (#%d)\tCaller: %s\n"
        ;
        goto LAB_005061aa;
      }
    }
  }
  else if (iVar20 == 0) {
    return false;
  }
  if ((callInstr->m_src2 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(callInstr->m_src2), bVar2))
  {
    pSVar12 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
    pSVar13 = Sym::AsStackSym(pSVar12->m_sym);
    AVar3 = StackSym::GetArgSlotNum(pSVar13);
    if (0xf < AVar3) {
      uVar6 = Func::GetSourceContextId(this->topFunc);
      uVar7 = Func::GetLocalFunctionId(this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
      if (!bVar2) {
        return false;
      }
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
      pSVar12 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
      pSVar13 = Sym::AsStackSym(pSVar12->m_sym);
      AVar3 = StackSym::GetArgSlotNum(pSVar13);
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
      Output::Print(L"INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (#%d)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (#%d)\n"
                    ,pcVar9,(ulong)(uint)builtInId._value,(ulong)AVar3,0xf,pcVar11,pcVar14);
      goto LAB_005067be;
    }
  }
  BVar8 = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
  if (((BVar8 & BIF_TypeSpecAllToFloat) == BIF_None) ||
     (bVar2 = GlobOpt::DoFloatTypeSpec(this->topFunc), bVar2)) {
    if (((BVar8 & BIF_TypeSpecDstToFloat) == BIF_None) ||
       ((BVar5 = Js::JavascriptLibrary::CanFloatPreferenceFunc(builtInId),
        inlineCallOpCode == InlineArrayPop || (BVar5 != 0)))) {
      if (((BVar8 & BIF_TypeSpecAllToInt) == BIF_None) ||
         (bVar2 = GlobOpt::DoAggressiveIntTypeSpec(this->topFunc), bVar2)) {
        if (inlineCallOpCode == InlineMathClz) {
          bVar2 = GlobOpt::DoLossyIntTypeSpec(this->topFunc);
          if (bVar2) {
LAB_005063dc:
            pOVar19 = callInstr->m_src1;
            if (pOVar19 == (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar15 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x95c,"(callInstr->GetSrc1())","callInstr->GetSrc1()");
              if (!bVar2) goto LAB_005067dd;
              *puVar15 = 0;
              pOVar19 = callInstr->m_src1;
            }
            bVar2 = IR::Opnd::IsRegOpnd(pOVar19);
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar15 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x95d,"(callInstr->GetSrc1()->IsRegOpnd())",
                                 "callInstr->GetSrc1()->IsRegOpnd()");
              if (!bVar2) goto LAB_005067dd;
              *puVar15 = 0;
            }
            pRVar16 = IR::Opnd::AsRegOpnd(callInstr->m_src1);
            if (pRVar16->m_sym == (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar15 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x95e,"(callInstr->GetSrc1()->AsRegOpnd()->m_sym)",
                                 "callInstr->GetSrc1()->AsRegOpnd()->m_sym");
              if (!bVar2) goto LAB_005067dd;
              *puVar15 = 0;
            }
            if ((((BVar8 >> 0xe & 1) == 0) && (inlineCallOpCode != InlineArrayPop)) &&
               (callInstr->m_dst == (Opnd *)0x0)) {
              uVar6 = Func::GetSourceContextId(this->topFunc);
              uVar7 = Func::GetLocalFunctionId(this->topFunc);
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
              if (!bVar2) {
                return false;
              }
              pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
              pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
              pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
              pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8)
              ;
              pcVar18 = 
              L"INLINING: Skip Inline: inlinee\'s return value is not assigned to anything\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
              ;
            }
            else {
              sVar17 = Js::JavascriptLibrary::GetArgCForBuiltIn(builtInId);
              pOVar19 = callInstr->m_src2;
              pSVar12 = IR::Opnd::AsSymOpnd(pOVar19);
              pSVar13 = Sym::AsStackSym(pSVar12->m_sym);
              AVar3 = StackSym::GetArgSlotNum(pSVar13);
              iVar20 = (((uint)AVar3 - (uint)isCallApplyTarget & 0xffff) - 1) +
                       (uint)((BVar8 >> 0xc & 1) != 0);
              if (iVar20 < 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar15 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x973,"(inlineCallArgCount >= 0)","inlineCallArgCount >= 0");
                if (!bVar2) {
LAB_005067dd:
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                *puVar15 = 0;
              }
              bVar2 = IR::Opnd::IsSymOpnd(pOVar19);
              if (!bVar2) {
                return true;
              }
              if ((BVar8 >> 0xd & 1) == 0) {
                if (sVar17 == (long)iVar20) {
                  return true;
                }
                uVar6 = Func::GetSourceContextId(this->topFunc);
                uVar7 = Func::GetLocalFunctionId(this->topFunc);
                bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
                if (!bVar2) {
                  return false;
                }
                pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
                pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
                pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_a8);
                pcVar18 = 
                L"INLINING: Skip Inline: parameter count doesn\'t match dynamic profile\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                ;
              }
              else {
                if ((long)iVar20 <= (long)sVar17) {
                  return true;
                }
                uVar6 = Func::GetSourceContextId(this->topFunc);
                uVar7 = Func::GetLocalFunctionId(this->topFunc);
                bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
                if (!bVar2) {
                  return false;
                }
                pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
                pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
                pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_a8);
                pcVar18 = 
                L"INLINING: Skip Inline: parameter count exceeds the maximum number of parameters allowed\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                ;
              }
            }
          }
          else {
            uVar6 = Func::GetSourceContextId(this->topFunc);
            uVar7 = Func::GetLocalFunctionId(this->topFunc);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
            if (!bVar2) {
              return false;
            }
            pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
            pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
            pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
            pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
            pcVar18 = 
            L"INLINING: Skip Inline: lossy int type spec is off, it\'s required for Math.clz32 to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
            ;
          }
        }
        else if (inlineCallOpCode == InlineFunctionApply) {
          bVar2 = Func::GetHasStackArgs(callInstr->m_func);
          if (bVar2) {
            pJVar10 = Func::GetJITFunctionBody(this->topFunc);
            bVar2 = JITTimeFunctionBody::IsInlineApplyDisabled(pJVar10);
            if (!bVar2) goto LAB_005063dc;
          }
          uVar6 = Func::GetSourceContextId(this->topFunc);
          uVar7 = Func::GetLocalFunctionId(this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
          if (!bVar2) {
            return false;
          }
          pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
          pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
          pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
          pcVar18 = 
          L"INLINING: Skip Inline: stack args of inlining is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
          ;
        }
        else {
          if ((inlineCallOpCode != InlineMathImul) ||
             (bVar2 = GlobOpt::DoLossyIntTypeSpec(this->topFunc), bVar2)) goto LAB_005063dc;
          uVar6 = Func::GetSourceContextId(this->topFunc);
          uVar7 = Func::GetLocalFunctionId(this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
          if (!bVar2) {
            return false;
          }
          pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
          pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
          pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
          pcVar18 = 
          L"INLINING: Skip Inline: lossy int type spec is off, it\'s required for Math.imul to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
          ;
        }
      }
      else {
        uVar6 = Func::GetSourceContextId(this->topFunc);
        uVar7 = Func::GetLocalFunctionId(this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
        if (!bVar2) {
          return false;
        }
        pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
        pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
        pcVar18 = 
        L"INLINING: Skip Inline: int type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n";
      }
    }
    else {
      uVar6 = Func::GetSourceContextId(this->topFunc);
      uVar7 = Func::GetLocalFunctionId(this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
      if (!bVar2) {
        return false;
      }
      pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
      pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
      pcVar18 = 
      L"INLINING: Skip Inline: Cannot float-type-spec the inlinee\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
      ;
    }
  }
  else {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
    if (!bVar2) {
      return false;
    }
    pcVar9 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
    pJVar10 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
    pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
    pcVar18 = L"INLINING: Skip Inline: float type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
    ;
  }
  Output::Print(pcVar18,pcVar9,(ulong)(uint)builtInId._value,pcVar11,pcVar14);
LAB_005067be:
  Output::Flush();
  return false;
}

Assistant:

bool
Inline::CanInlineBuiltInFunction(IR::Instr *callInstr, const FunctionJITTimeInfo * inlineeData, Js::OpCode inlineCallOpCode, const FunctionJITTimeInfo * inlinerData, Js::BuiltinFunction builtInId, bool isCallApplyTarget)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    if (inlineCallOpCode == 0)
    {
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathFloor || inlineCallOpCode == Js::OpCode::InlineMathCeil || inlineCallOpCode == Js::OpCode::InlineMathRound)
    {
#if defined(_M_IX86) || defined(_M_X64)
        if (!AutoSystemInfo::Data.SSE4_1Available())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: SSE4.1 not available\tInlinee: %s (#%d)\tCaller: %s\n"), Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, inlinerData->GetBody()->GetDisplayName());
            return false;
        }
#endif
        if (callInstr->m_func->GetTopFunc()->HasProfileInfo() && callInstr->m_func->GetTopFunc()->GetReadOnlyProfileInfo()->IsFloorInliningDisabled())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Floor Inlining Disabled\tInlinee: %s (#%d)\tCaller: %s\n"), Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, inlinerData->GetBody()->GetDisplayName());
            return false;
        }
    }

    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (#%d)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (#%d)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);

    bool isAnyArgFloat = (builtInFlags & Js::BuiltInFlags::BIF_TypeSpecAllToFloat) != 0;
    if (isAnyArgFloat && !GlobOpt::DoFloatTypeSpec(this->topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: float type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    bool canDstBeFloat = (builtInFlags & Js::BuiltInFlags::BIF_TypeSpecDstToFloat) != 0;
    if (canDstBeFloat && !Js::JavascriptLibrary::CanFloatPreferenceFunc(builtInId) && inlineCallOpCode != Js::OpCode::InlineArrayPop)
    {
        // Note that for Math.abs that means that even though it can potentially be type-spec'd to int, we won't inline it.
        // Some built-in functions, such as atan2, are disabled for float-pref.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Cannot float-type-spec the inlinee\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, // Get the _value (cause operator _E) to avoid using struct directly.
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    bool isAnyArgInt = (builtInFlags & (Js::BuiltInFlags::BIF_TypeSpecDstToInt | Js::BuiltInFlags::BIF_TypeSpecSrc1ToInt | Js::BuiltInFlags::BIF_TypeSpecSrc2ToInt)) != 0;
    if (isAnyArgInt && !GlobOpt::DoAggressiveIntTypeSpec(this->topFunc))
    {
        // Note that for Math.abs that means that even though it can potentially be type-spec'd to float, we won't inline it.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: int type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathImul && !GlobOpt::DoLossyIntTypeSpec(topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: lossy int type spec is off, it's required for Math.imul to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathClz && !GlobOpt::DoLossyIntTypeSpec(topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: lossy int type spec is off, it's required for Math.clz32 to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineFunctionApply && (!callInstr->m_func->GetHasStackArgs() || this->topFunc->GetJITFunctionBody()->IsInlineApplyDisabled()))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: stack args of inlining is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    // TODO: when adding support for other type spec args (array, string) do appropriate check as well.

    Assert(callInstr->GetSrc1());
    Assert(callInstr->GetSrc1()->IsRegOpnd());
    Assert(callInstr->GetSrc1()->AsRegOpnd()->m_sym);

    if (!(builtInFlags & Js::BuiltInFlags::BIF_IgnoreDst) && callInstr->GetDst() == nullptr && inlineCallOpCode != Js::OpCode::InlineArrayPop)
    {
        // Is seems that it's not worth optimizing odd cases where the result is unused.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: inlinee's return value is not assigned to anything\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    // Number of arguments, not including "this".
    IntConstType requiredInlineCallArgCount = (IntConstType)Js::JavascriptLibrary::GetArgCForBuiltIn(builtInId);

    IR::Opnd* linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() - (isCallApplyTarget ? 1 : 0);

    // Check for missing actuals:
    // if number of passed params to built-in function is not what it needs, don't inline.
    bool usesThisArgument = (builtInFlags & Js::BuiltInFlags::BIF_UseSrc0) != 0;
    int inlineCallArgCount = (int)(usesThisArgument ? actualCount : actualCount - 1);
    Assert(inlineCallArgCount >= 0);

    if (linkOpnd->IsSymOpnd())
    {
        if ((builtInFlags & Js::BuiltInFlags::BIF_VariableArgsNumber) != 0)
        {
            if (inlineCallArgCount > requiredInlineCallArgCount)
            {
                INLINE_TESTTRACE(_u("INLINING: Skip Inline: parameter count exceeds the maximum number of parameters allowed\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
                    Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
                return false;
            }
        }
        else if (inlineCallArgCount != requiredInlineCallArgCount)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: parameter count doesn't match dynamic profile\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
                Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
                inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
            return false;
        }
    }

    return true;
}